

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.cpp
# Opt level: O0

void kmpc_poolprint(void)

{
  kmp_info_t *unaff_retaddr;
  kmp_info_t *th;
  kmp_info_t *in_stack_00000028;
  
  __kmp_get_global_thread_id();
  __kmp_bget_dequeue(unaff_retaddr);
  bfreed(in_stack_00000028);
  return;
}

Assistant:

void kmpc_poolprint(void) {
  kmp_info_t *th = __kmp_get_thread();

  __kmp_bget_dequeue(th); /* Release any queued buffers */

  bfreed(th);
}